

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void __thiscall HawkTracer::parser::Event::Value::Value(Value *this,Value *other)

{
  EventKlassField *pEVar1;
  Event *other_00;
  size_t sVar2;
  char *__dest;
  Event *this_00;
  
  this->field = (EventKlassField *)0x0;
  pEVar1 = other->field;
  this->field = pEVar1;
  if (pEVar1 != (EventKlassField *)0x0) {
    if (pEVar1->_type_id == STRUCT) {
      other_00 = (other->value).f_EVENT;
      if (other_00 != (Event *)0x0) {
        this_00 = (Event *)operator_new(0x50);
        Event(this_00,other_00);
        (this->value).f_EVENT = this_00;
        return;
      }
    }
    else {
      if (pEVar1->_type_id != STRING) {
        this->value = other->value;
        return;
      }
      if ((other->value).f_STRING != (char *)0x0) {
        sVar2 = strlen((other->value).f_STRING);
        __dest = (char *)malloc(sVar2 + 1);
        (this->value).f_POINTER = __dest;
        strcpy(__dest,(other->value).f_STRING);
        return;
      }
    }
    (this->value).f_UINT64 = 0;
  }
  return;
}

Assistant:

Event::Value::Value(const Value& other)
{
    field = other.field;

    if (!field)
    {
        return;
    }

    switch (field->get_type_id())
    {
    case FieldTypeId::STRING:
        if (other.value.f_STRING)
        {
            value.f_STRING = (char*)malloc(strlen(other.value.f_STRING) + 1);
            strcpy(value.f_STRING, other.value.f_STRING);
        }
        else
        {
            value.f_STRING = nullptr;
        }
        break;
    case FieldTypeId::STRUCT:
        if (other.value.f_EVENT)
        {
            value.f_EVENT = new Event(*other.value.f_EVENT);
        }
        else
        {
            value.f_EVENT = nullptr;
        }
        break;
    default:
        value = other.value;
    }
}